

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonvalue.cpp
# Opt level: O0

void __thiscall QJsonValue::QJsonValue(QJsonValue *this,Type type)

{
  int in_ESI;
  QCborValue *in_RDI;
  long in_FS_OFFSET;
  int iVar1;
  QCborValue local_98;
  QCborValue local_80;
  QCborValue local_68;
  QCborValue local_50;
  QCborValue local_38;
  QCborValue local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QCborValue::QCborValue(in_RDI);
  if (in_ESI == 0) {
    iVar1 = in_ESI;
    QCborValue::QCborValue(&local_20,Null);
    QCborValue::operator=((QCborValue *)CONCAT44(iVar1,in_ESI),in_RDI);
    QCborValue::~QCborValue(in_RDI);
  }
  else if (in_ESI == 1) {
    iVar1 = in_ESI;
    QCborValue::QCborValue(&local_38,False);
    QCborValue::operator=((QCborValue *)CONCAT44(iVar1,in_ESI),in_RDI);
    QCborValue::~QCborValue(in_RDI);
  }
  else if (in_ESI == 2) {
    iVar1 = in_ESI;
    QCborValue::QCborValue(&local_50,Double);
    QCborValue::operator=((QCborValue *)CONCAT44(iVar1,in_ESI),in_RDI);
    QCborValue::~QCborValue(in_RDI);
  }
  else if (in_ESI == 3) {
    iVar1 = in_ESI;
    QCborValue::QCborValue(&local_68,String);
    QCborValue::operator=((QCborValue *)CONCAT44(iVar1,in_ESI),in_RDI);
    QCborValue::~QCborValue(in_RDI);
  }
  else if (in_ESI == 4) {
    iVar1 = in_ESI;
    QCborValue::QCborValue(&local_80,Array);
    QCborValue::operator=((QCborValue *)CONCAT44(iVar1,in_ESI),in_RDI);
    QCborValue::~QCborValue(in_RDI);
  }
  else if (in_ESI == 5) {
    iVar1 = in_ESI;
    QCborValue::QCborValue(&local_98,Map);
    QCborValue::operator=((QCborValue *)CONCAT44(iVar1,in_ESI),in_RDI);
    QCborValue::~QCborValue(in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QJsonValue::QJsonValue(Type type)
{
    switch (type) {
    case Null:
        value = QCborValue::Null;
        break;
    case Bool:
        value = QCborValue::False;
        break;
    case Double:
        value = QCborValue::Double;
        break;
    case String:
        value = QCborValue::String;
        break;
    case Array:
        value = QCborValue::Array;
        break;
    case Object:
        value = QCborValue::Map;
        break;
    case Undefined:
        break;
    }
}